

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 ExprMakeTree(jx9_gen_state *pGen,jx9_expr_node **apNode,sxi32 nToken)

{
  jx9_expr_node **ppjVar1;
  jx9_expr_node *pjVar2;
  jx9_expr_node *pjVar3;
  jx9_expr_op *pjVar4;
  uint uVar5;
  sxi32 sVar6;
  uint uVar7;
  SyToken *pSVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  sxu32 sVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint unaff_EBP;
  ulong uVar17;
  ulong uVar18;
  jx9_expr_op *pjVar19;
  ulong uVar20;
  jx9_expr_node *pjVar21;
  ulong uVar22;
  size_t __n;
  int iVar23;
  ulong uVar24;
  jx9_expr_node **ppjVar25;
  uint uVar26;
  bool bVar27;
  uint local_8c;
  
  uVar9 = (ulong)(uint)nToken;
  if (nToken < 1) {
    return 0;
  }
  if ((nToken == 1) && ((*apNode)->xCode != (ProcNodeConstruct)0x0)) {
    return 0;
  }
  uVar11 = (ulong)(uint)nToken;
  iVar23 = 0;
  local_8c = unaff_EBP;
  do {
    bVar27 = false;
    iVar12 = iVar23;
    if ((apNode[iVar23] != (jx9_expr_node *)0x0) && (apNode[iVar23]->pStart->nType == 0x200)) {
      uVar5 = iVar23 + 1;
      uVar20 = (ulong)uVar5;
      if ((int)uVar5 < nToken) {
        iVar12 = 1;
        uVar24 = (long)(int)uVar5;
        do {
          if (apNode[uVar24] != (jx9_expr_node *)0x0) {
            uVar26 = apNode[uVar24]->pStart->nType;
            if ((uVar26 >> 10 & 1) == 0) {
              iVar12 = iVar12 + (uint)((uVar26 >> 9 & 1) != 0);
            }
            else {
              uVar20 = uVar24;
              if (iVar12 < 2) break;
              iVar12 = iVar12 + -1;
            }
          }
          uVar24 = uVar24 + 1;
          uVar20 = uVar11;
        } while (uVar11 != uVar24);
      }
      iVar12 = (int)uVar20;
      if ((iVar12 - iVar23 < 2) ||
         (uVar5 = ExprMakeTree(pGen,apNode + (int)uVar5,(iVar12 - iVar23) + -1), uVar5 == 0)) {
        ExprFreeTree(pGen,apNode[iVar23]);
        ExprFreeTree(pGen,apNode[iVar12]);
        bVar27 = false;
        apNode[iVar23] = (jx9_expr_node *)0x0;
        apNode[iVar12] = (jx9_expr_node *)0x0;
      }
      else {
        bVar27 = true;
        local_8c = uVar5;
      }
    }
    if (bVar27) {
      return local_8c;
    }
    iVar23 = iVar12 + 1;
  } while (iVar23 < nToken);
  uVar20 = 1;
  if (1 < nToken) {
    uVar20 = (ulong)(uint)nToken;
  }
  uVar5 = 0xffffffff;
  uVar17 = 1;
  uVar22 = 0;
  ppjVar25 = apNode;
  uVar24 = uVar9;
  do {
    uVar18 = uVar17;
    if ((int)uVar17 < nToken) {
      uVar18 = uVar9;
    }
    uVar7 = (uint)uVar18;
    pjVar2 = apNode[uVar22];
    uVar26 = uVar5;
    if (pjVar2 != (jx9_expr_node *)0x0) {
      pjVar19 = pjVar2->pOp;
      uVar26 = (uint)uVar22;
      if (((pjVar19 != (jx9_expr_op *)0x0) && (pjVar19->iPrec == 2)) &&
         (pjVar2->pLeft == (jx9_expr_node *)0x0)) {
        if (pjVar19->iOp == 2) {
          bVar27 = true;
          if (-1 < (int)uVar5) {
            if ((apNode[uVar5]->xCode == jx9CompileVariable) ||
               ((pjVar19 = apNode[uVar5]->pOp, pjVar19 != (jx9_expr_op *)0x0 &&
                (pjVar19->iPrec == 2)))) {
              uVar18 = uVar22 + 1;
              uVar16 = uVar18 & 0xffffffff;
              if (uVar18 < uVar11) {
                iVar23 = 1;
                uVar15 = uVar17;
                do {
                  if (apNode[uVar15] != (jx9_expr_node *)0x0) {
                    uVar7 = apNode[uVar15]->pStart->nType;
                    if ((uVar7 >> 0xb & 1) == 0) {
                      if ((uVar7 >> 0xc & 1) != 0) {
                        uVar16 = uVar15;
                        if (iVar23 < 2) break;
                        iVar23 = iVar23 + -1;
                      }
                    }
                    else {
                      iVar23 = iVar23 + 1;
                    }
                  }
                  uVar15 = uVar15 + 1;
                  uVar16 = uVar11;
                } while (uVar11 != uVar15);
              }
              if (uVar18 < (uVar16 & 0xffffffff)) {
                uVar7 = ExprMakeTree(pGen,apNode + uVar18,~uVar26 + (int)uVar16);
                if (uVar7 != 0) {
                  bVar27 = false;
                  local_8c = uVar7;
                  goto joined_r0x0012906e;
                }
                SySetPut(&pjVar2->aNodeArgs,apNode + uVar18);
              }
              pjVar2->pLeft = apNode[uVar5];
              pjVar2->pRight = (jx9_expr_node *)0x0;
              apNode[uVar5] = (jx9_expr_node *)0x0;
              if (uVar22 < (uVar16 & 0xffffffff)) {
                memset(apNode + uVar22 + 1,0,(ulong)((int)uVar16 + ~uVar26) * 8 + 8);
              }
              bVar27 = true;
            }
          }
        }
        else {
          uVar18 = uVar17;
          if (pjVar19->iOp != 3) {
            do {
              if (uVar11 <= uVar18) goto LAB_00129095;
              uVar16 = uVar18 + 1;
              ppjVar1 = apNode + uVar18;
              uVar18 = uVar16;
            } while (*ppjVar1 == (jx9_expr_node *)0x0);
            uVar7 = (int)uVar16 - 1;
LAB_00129095:
            if (((int)uVar7 < nToken) && (-1 < (int)uVar5)) {
              pjVar3 = apNode[uVar7];
              if ((pjVar3 != (jx9_expr_node *)0x0) &&
                 ((pjVar3->pOp == (jx9_expr_op *)0x0 || (pjVar3->pLeft != (jx9_expr_node *)0x0)))) {
                pjVar3 = apNode[uVar5];
                if (pjVar3 != (jx9_expr_node *)0x0) {
                  pjVar19 = pjVar3->pOp;
                  if (pjVar19 == (jx9_expr_op *)0x0) {
                    pjVar2->pLeft = pjVar3;
LAB_0012921e:
                    if (pjVar3->xCode != jx9CompileVariable) {
                      sVar13 = pjVar2->pStart->nLine;
                      pcVar10 = "\'%z\': Expecting a variable as left operand";
                      goto LAB_001297e7;
                    }
                  }
                  else {
                    if (pjVar3->pLeft == (jx9_expr_node *)0x0) goto LAB_0012982d;
                    pjVar2->pLeft = pjVar3;
                    if (pjVar19 == (jx9_expr_op *)0x0) goto LAB_0012921e;
                  }
                  pjVar2->pRight = apNode[uVar7];
                  apNode[uVar7] = (jx9_expr_node *)0x0;
                  apNode[uVar5] = (jx9_expr_node *)0x0;
                  goto LAB_00129111;
                }
              }
            }
LAB_0012982d:
            sVar13 = pjVar2->pStart->nLine;
            pcVar10 = "\'%z\': Missing/Invalid member name";
            goto LAB_001297e7;
          }
          bVar27 = uVar22 < uVar11;
          if (bVar27) {
            __n = 0;
            lVar14 = 0;
            iVar23 = 0;
            do {
              if (*(long *)((long)ppjVar25 + __n) != 0) {
                uVar7 = *(uint *)(*(long *)(*(long *)((long)ppjVar25 + __n) + 0x18) + 0x10);
                if ((uVar7 >> 9 & 1) == 0) {
                  if ((uVar7 >> 10 & 1) != 0) {
                    if (iVar23 < 2) {
                      if (bVar27) {
                        if (-1 < (int)uVar5) {
                          pjVar3 = apNode[uVar5];
                          if ((pjVar3 != (jx9_expr_node *)0x0) &&
                             ((pjVar3->pOp == (jx9_expr_op *)0x0 ||
                              (pjVar3->pLeft != (jx9_expr_node *)0x0)))) {
                            if ((1 < (ulong)-lVar14) &&
                               (uVar7 = ExprProcessFuncArguments
                                                  (pGen,pjVar2,apNode + uVar22 + 1,~(uint)lVar14),
                               uVar7 != 0)) goto LAB_0012905a;
                            pjVar2->pLeft = apNode[uVar5];
                            apNode[uVar5] = (jx9_expr_node *)0x0;
                            if (lVar14 != 0) {
                              memset(apNode + uVar22 + 1,0,__n);
                            }
                            bVar27 = true;
                            goto joined_r0x0012906e;
                          }
                        }
                        sVar13 = pjVar2->pStart->nLine;
                        pcVar10 = "Invalid function name";
                        goto LAB_00129037;
                      }
                      break;
                    }
                    iVar23 = iVar23 + -1;
                  }
                }
                else {
                  iVar23 = iVar23 + 1;
                }
              }
              bVar27 = uVar18 < uVar11;
              lVar14 = lVar14 + -1;
              __n = __n + 8;
              uVar18 = uVar18 + 1;
            } while (-lVar14 != uVar24);
          }
          sVar13 = pjVar2->pStart->nLine;
          pcVar10 = "Missing right parenthesis \')\'";
LAB_00129037:
          sVar6 = jx9GenCompileError(pGen,1,sVar13,pcVar10);
          uVar7 = (uint)(sVar6 == -10) * 2 | 0xfffffff4;
LAB_0012905a:
          local_8c = uVar7;
          bVar27 = false;
        }
joined_r0x0012906e:
        if (!bVar27) {
          return local_8c;
        }
      }
    }
LAB_00129111:
    uVar5 = uVar26;
    uVar22 = uVar22 + 1;
    uVar17 = uVar17 + 1;
    uVar24 = (ulong)((int)uVar24 - 1);
    ppjVar25 = ppjVar25 + 1;
  } while (uVar22 != uVar20);
  uVar20 = 1;
  if (1 < nToken) {
    uVar20 = (ulong)(uint)nToken;
  }
  uVar5 = 0xffffffff;
  uVar24 = 0;
  do {
    pjVar2 = apNode[uVar24];
    if (pjVar2 != (jx9_expr_node *)0x0) {
      if ((((pjVar2->pOp != (jx9_expr_op *)0x0) && (pjVar2->pOp->iPrec == 3)) &&
          (pjVar2->pLeft == (jx9_expr_node *)0x0)) && (-1 < (int)uVar5)) {
        pjVar3 = apNode[uVar5];
        if (((pjVar3->pOp != (jx9_expr_op *)0x0) && (pjVar3->pOp->iPrec == 2)) ||
           (pjVar3->xCode == jx9CompileVariable)) {
          pjVar2->pLeft = pjVar3;
          apNode[uVar5] = (jx9_expr_node *)0x0;
        }
      }
      uVar5 = (uint)uVar24;
    }
    uVar24 = uVar24 + 1;
  } while (uVar20 != uVar24);
  uVar24 = (ulong)(nToken - 1);
  uVar5 = 0xffffffff;
  uVar17 = uVar24;
  sVar6 = nToken;
  do {
    pjVar2 = apNode[uVar17];
    if (pjVar2 != (jx9_expr_node *)0x0) {
      if (((pjVar2->pOp != (jx9_expr_op *)0x0) && (pjVar2->pOp->iPrec == 3)) &&
         (pjVar2->pLeft == (jx9_expr_node *)0x0)) {
        if ((int)uVar5 < 0) {
LAB_0012981d:
          sVar13 = pjVar2->pStart->nLine;
          pcVar10 = "\'%z\' operator needs l-value";
          goto LAB_001297e7;
        }
        pjVar3 = apNode[uVar5];
        if (pjVar3->pOp == (jx9_expr_op *)0x0) {
          if (pjVar3->xCode != jx9CompileVariable) goto LAB_0012981d;
        }
        else if (pjVar3->pOp->iPrec != 2) goto LAB_0012981d;
        pjVar2->pLeft = pjVar3;
        apNode[uVar5] = (jx9_expr_node *)0x0;
        *(byte *)&pjVar2->iFlags = (byte)pjVar2->iFlags | 1;
      }
      uVar5 = (uint)uVar17;
    }
    uVar17 = uVar17 - 1;
    sVar6 = sVar6 + -1;
  } while (0 < sVar6);
  uVar5 = 0;
  uVar17 = uVar24;
  sVar6 = nToken;
  do {
    pjVar2 = apNode[uVar17];
    if (pjVar2 != (jx9_expr_node *)0x0) {
      if (((pjVar2->pOp != (jx9_expr_op *)0x0) && (pjVar2->pOp->iPrec == 4)) &&
         (pjVar2->pLeft == (jx9_expr_node *)0x0)) {
        if ((int)uVar5 < 1) {
          pSVar8 = pjVar2->pStart;
        }
        else {
          pjVar2->pLeft = apNode[uVar5];
          apNode[uVar5] = (jx9_expr_node *)0x0;
          pjVar2 = pjVar2->pLeft;
          if (((pjVar2 == (jx9_expr_node *)0x0) || (pjVar2->pOp == (jx9_expr_op *)0x0)) ||
             ((pjVar2->pOp->iPrec < 5 ||
              ((pjVar2->pLeft != (jx9_expr_node *)0x0 && (pjVar2->pRight != (jx9_expr_node *)0x0))))
             )) goto LAB_001294ef;
          pSVar8 = pjVar2->pStart;
        }
        sVar13 = pSVar8->nLine;
        pcVar10 = "\'%z\': Missing operand";
        goto LAB_001297e7;
      }
LAB_001294ef:
      uVar5 = (uint)uVar17;
    }
    uVar17 = uVar17 - 1;
    sVar6 = sVar6 + -1;
  } while (0 < sVar6);
  uVar17 = 1;
  if (1 < nToken) {
    uVar17 = (ulong)(uint)nToken;
  }
  iVar23 = 7;
  do {
    uVar5 = 0xffffffff;
    uVar18 = 1;
    uVar22 = 0;
    do {
      uVar16 = uVar18;
      if ((int)uVar18 < nToken) {
        uVar16 = uVar9;
      }
      uVar26 = (uint)uVar16;
      pjVar2 = apNode[uVar22];
      if (pjVar2 != (jx9_expr_node *)0x0) {
        if (((pjVar2->pOp != (jx9_expr_op *)0x0) && (pjVar2->pOp->iPrec == iVar23)) &&
           (uVar16 = uVar18, pjVar2->pLeft == (jx9_expr_node *)0x0)) {
          do {
            if (uVar11 <= uVar16) goto LAB_001295c2;
            uVar15 = uVar16 + 1;
            ppjVar25 = apNode + uVar16;
            uVar16 = uVar15;
          } while (*ppjVar25 == (jx9_expr_node *)0x0);
          uVar26 = (int)uVar15 - 1;
LAB_001295c2:
          if (((int)uVar26 < nToken) && (-1 < (int)uVar5)) {
            pjVar3 = apNode[uVar26];
            if ((pjVar3 != (jx9_expr_node *)0x0) &&
               ((pjVar3->pOp == (jx9_expr_op *)0x0 || (pjVar3->pLeft != (jx9_expr_node *)0x0)))) {
              pjVar3 = apNode[uVar5];
              if ((pjVar3 != (jx9_expr_node *)0x0) &&
                 ((pjVar3->pOp == (jx9_expr_op *)0x0 || (pjVar3->pLeft != (jx9_expr_node *)0x0)))) {
                pjVar2->pLeft = pjVar3;
                pjVar2->pRight = apNode[uVar26];
                apNode[uVar26] = (jx9_expr_node *)0x0;
                apNode[uVar5] = (jx9_expr_node *)0x0;
                goto LAB_00129633;
              }
            }
          }
          pSVar8 = pjVar2->pStart;
          goto LAB_001297dd;
        }
LAB_00129633:
        uVar5 = (uint)uVar22;
      }
      uVar22 = uVar22 + 1;
      uVar18 = uVar18 + 1;
    } while (uVar22 != uVar17);
    iVar23 = iVar23 + 1;
  } while (iVar23 != 0x11);
  uVar22 = 0xffffffff;
  lVar14 = -8;
  uVar17 = 1;
  do {
    pjVar2 = apNode[uVar17 - 1];
    if (pjVar2 != (jx9_expr_node *)0x0) {
      pjVar19 = pjVar2->pOp;
      if (((pjVar19 != (jx9_expr_op *)0x0) && (pjVar19->iOp == 0x26)) &&
         (pjVar2->pLeft == (jx9_expr_node *)0x0)) {
        if ((((int)uVar22 < 0) || (pjVar3 = apNode[uVar22], pjVar3 == (jx9_expr_node *)0x0)) ||
           ((pjVar3->pOp != (jx9_expr_op *)0x0 && (pjVar3->pLeft == (jx9_expr_node *)0x0)))) {
          sVar13 = pjVar2->pStart->nLine;
          pcVar10 = "\'%z\': Syntax error";
          goto LAB_00129a5c;
        }
        uVar5 = (uint)uVar17;
        if (nToken <= (int)uVar5) {
          uVar18 = uVar17 & 0xffffffff;
          goto LAB_00129aa4;
        }
        iVar23 = 1;
        uVar20 = uVar17;
        goto LAB_00129a00;
      }
      uVar22 = uVar17 - 1 & 0xffffffff;
    }
    lVar14 = lVar14 + -8;
    bVar27 = uVar17 != uVar20;
    uVar17 = uVar17 + 1;
  } while (bVar27);
  goto LAB_001296ad;
LAB_00129a00:
  do {
    pjVar3 = apNode[uVar20];
    if (pjVar3 != (jx9_expr_node *)0x0) {
      if (((pjVar3->pOp == (jx9_expr_op *)0x0) || (pjVar3->pOp->iOp != 0x26)) ||
         (pjVar3->pCond != (jx9_expr_node *)0x0)) {
        if ((pjVar3->pStart->nType & 0x100000) != 0) {
          uVar18 = uVar20;
          if (iVar23 < 2) break;
          iVar23 = iVar23 + -1;
        }
      }
      else {
        iVar23 = iVar23 + 1;
      }
    }
    uVar20 = uVar20 + 1;
    uVar18 = uVar11;
  } while (uVar11 != uVar20);
LAB_00129aa4:
  uVar26 = (uint)uVar18;
  if (uVar5 < uVar26) {
    uVar5 = ExprMakeTree(pGen,(jx9_expr_node **)((long)apNode - lVar14),uVar26 - uVar5);
    if (uVar5 == 0) {
      pjVar2->pLeft = apNode[uVar17];
      apNode[uVar17] = (jx9_expr_node *)0x0;
      if (nToken <= (int)(uVar26 + 1)) {
        pjVar19 = pjVar2->pOp;
        sVar13 = pjVar2->pStart->nLine;
        pcVar10 = "\'%z\': Missing \'else\' expression";
        goto LAB_00129a5c;
      }
      ppjVar25 = apNode + (uVar26 + 1);
      uVar5 = ExprMakeTree(pGen,ppjVar25,~uVar26 + nToken);
      if (uVar5 != 0) goto LAB_00129ac5;
      pjVar2->pRight = *ppjVar25;
      apNode[uVar18 & 0xffffffff] = (jx9_expr_node *)0x0;
      *ppjVar25 = (jx9_expr_node *)0x0;
      pjVar2->pCond = apNode[uVar22];
      apNode[uVar22] = (jx9_expr_node *)0x0;
      bVar27 = true;
    }
    else {
LAB_00129ac5:
      bVar27 = false;
      local_8c = uVar5;
    }
  }
  else {
    sVar13 = pjVar2->pStart->nLine;
    pcVar10 = "\'%z\': Missing \'then\' expression";
LAB_00129a5c:
    bVar27 = false;
    sVar6 = jx9GenCompileError(pGen,1,sVar13,pcVar10,pjVar19);
    local_8c = (uint)(sVar6 == -10) * 2 | 0xfffffff4;
  }
  if (!bVar27) {
    return local_8c;
  }
LAB_001296ad:
  uVar20 = 0xffffffff;
  do {
    pjVar2 = apNode[uVar24];
    uVar26 = (uint)uVar24;
    uVar5 = (uint)uVar20;
    if ((((pjVar2 != (jx9_expr_node *)0x0) &&
         (pjVar19 = pjVar2->pOp, uVar5 = uVar26, pjVar19 != (jx9_expr_op *)0x0)) &&
        (pjVar19->iPrec == 0x12)) && (uVar17 = uVar24, pjVar2->pLeft == (jx9_expr_node *)0x0)) {
      do {
        uVar22 = uVar17 - 1;
        iVar23 = (int)uVar17;
        if (iVar23 < 1) break;
        uVar17 = uVar22;
      } while (apNode[uVar22 & 0xffffffff] == (jx9_expr_node *)0x0);
      if (((0 < iVar23) && (-1 < (int)(uint)uVar20)) &&
         ((pjVar3 = apNode[uVar20], pjVar3 != (jx9_expr_node *)0x0 &&
          ((pjVar3->pOp == (jx9_expr_op *)0x0 || (pjVar3->pLeft != (jx9_expr_node *)0x0)))))) {
        uVar22 = uVar22 & 0xffffffff;
        pjVar21 = apNode[uVar22];
        if (pjVar21 != (jx9_expr_node *)0x0) {
          pjVar4 = pjVar21->pOp;
          if (pjVar4 == (jx9_expr_op *)0x0) {
LAB_001297a4:
            bVar27 = pjVar21->xCode == jx9CompileVariable;
LAB_001297af:
            if (!bVar27) {
LAB_001297b8:
              if (pjVar19->iVmOp != 0x2a) {
                sVar13 = pjVar2->pStart->nLine;
                pcVar10 = "\'%z\': Left operand must be a modifiable l-value";
                goto LAB_001297e7;
              }
            }
          }
          else {
            if (pjVar21->pLeft == (jx9_expr_node *)0x0) goto LAB_001299b0;
            if (pjVar4 == (jx9_expr_op *)0x0) goto LAB_001297a4;
            if (pjVar4->iOp != 0) {
              if (pjVar4->iOp == 2) {
                pjVar21 = pjVar21->pLeft;
                if (pjVar21->pOp == (jx9_expr_op *)0x0) goto LAB_001297a4;
                bVar27 = (pjVar21->pOp->iOp & 0xfffffffdU) == 0;
                goto LAB_001297af;
              }
              goto LAB_001297b8;
            }
          }
          pjVar2->pLeft = pjVar3;
          pjVar2->pRight = apNode[uVar22];
          apNode[uVar20] = (jx9_expr_node *)0x0;
          apNode[uVar22] = (jx9_expr_node *)0x0;
          goto LAB_0012978d;
        }
      }
LAB_001299b0:
      pSVar8 = pjVar2->pStart;
      goto LAB_001297dd;
    }
LAB_0012978d:
    uVar24 = uVar24 - 1;
    uVar20 = (ulong)uVar5;
  } while (0 < (int)uVar26);
  uVar20 = 1;
  if (1 < nToken) {
    uVar20 = (ulong)(uint)nToken;
  }
  uVar5 = 0xffffffff;
  uVar24 = 1;
  uVar17 = 0;
  do {
    uVar22 = uVar24;
    if ((int)uVar24 < nToken) {
      uVar22 = uVar9;
    }
    uVar26 = (uint)uVar22;
    pjVar2 = apNode[uVar17];
    if (pjVar2 != (jx9_expr_node *)0x0) {
      if (((pjVar2->pOp != (jx9_expr_op *)0x0) && (pjVar2->pOp->iPrec == 0x16)) &&
         (uVar22 = uVar24, pjVar2->pLeft == (jx9_expr_node *)0x0)) {
        do {
          if (uVar11 <= uVar22) goto LAB_001298cd;
          uVar18 = uVar22 + 1;
          ppjVar25 = apNode + uVar22;
          uVar22 = uVar18;
        } while (*ppjVar25 == (jx9_expr_node *)0x0);
        uVar26 = (int)uVar18 - 1;
LAB_001298cd:
        if (((int)uVar26 < nToken) && (-1 < (int)uVar5)) {
          pjVar3 = apNode[uVar26];
          if ((pjVar3 != (jx9_expr_node *)0x0) &&
             ((pjVar3->pOp == (jx9_expr_op *)0x0 || (pjVar3->pLeft != (jx9_expr_node *)0x0)))) {
            pjVar3 = apNode[uVar5];
            if ((pjVar3 != (jx9_expr_node *)0x0) &&
               ((pjVar3->pOp == (jx9_expr_op *)0x0 || (pjVar3->pLeft != (jx9_expr_node *)0x0)))) {
              pjVar2->pLeft = pjVar3;
              pjVar2->pRight = apNode[uVar26];
              apNode[uVar26] = (jx9_expr_node *)0x0;
              apNode[uVar5] = (jx9_expr_node *)0x0;
              goto LAB_00129942;
            }
          }
        }
        pSVar8 = pjVar2->pStart;
LAB_001297dd:
        sVar13 = pSVar8->nLine;
        pcVar10 = "\'%z\': Missing/Invalid operand";
        goto LAB_001297e7;
      }
LAB_00129942:
      uVar5 = (uint)uVar17;
    }
    uVar17 = uVar17 + 1;
    uVar24 = uVar24 + 1;
  } while (uVar17 != uVar20);
  if (nToken != 1) {
    uVar9 = 2;
    if (2 < nToken) {
      uVar9 = (ulong)(uint)nToken;
    }
    uVar11 = 1;
    do {
      pjVar2 = apNode[uVar11];
      if (pjVar2 != (jx9_expr_node *)0x0) {
        if (((pjVar2->pOp != (jx9_expr_op *)0x0) || (pjVar2->xCode != (ProcNodeConstruct)0x0)) &&
           (*apNode != (jx9_expr_node *)0x0)) {
          sVar13 = pjVar2->pStart->nLine;
          pcVar10 = "Unexpected token \'%z\'";
LAB_001297e7:
          sVar6 = jx9GenCompileError(pGen,1,sVar13,pcVar10);
          return (uint)(sVar6 == -10) * 2 | 0xfffffff4;
        }
        *apNode = pjVar2;
        apNode[uVar11] = (jx9_expr_node *)0x0;
      }
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  return 0;
}

Assistant:

static sxi32 ExprMakeTree(jx9_gen_state *pGen, jx9_expr_node **apNode, sxi32 nToken)
 {
	 sxi32 i, iLeft, iRight;
	 jx9_expr_node *pNode;
	 sxi32 iCur;
	 sxi32 rc;
	 if( nToken <= 0 || (nToken == 1 && apNode[0]->xCode) ){
		 /* TICKET 1433-17: self evaluating node */
		 return SXRET_OK;
	 }
	 /* Process expressions enclosed in parenthesis first */
	 for( iCur =  0 ; iCur < nToken ; ++iCur ){
		 sxi32 iNest;
		 /* Note that, we use strict comparison here '!=' instead of the bitwise and '&' operator
		  * since the LPAREN token can also be an operator [i.e: Function call].
		  */
		 if( apNode[iCur] == 0 || apNode[iCur]->pStart->nType != JX9_TK_LPAREN ){
			 continue;
		 }
		 iNest = 1;
		 iLeft = iCur;
		 /* Find the closing parenthesis */
		 iCur++;
		 while( iCur < nToken ){
			 if( apNode[iCur] ){
				 if( apNode[iCur]->pStart->nType & JX9_TK_RPAREN /* ')' */){
					 /* Decrement nesting level */
					 iNest--;
					 if( iNest <= 0 ){
						 break;
					 }
				 }else if( apNode[iCur]->pStart->nType & JX9_TK_LPAREN /* '(' */ ){
					 /* Increment nesting level */
					 iNest++;
				 }
			 }
			 iCur++;
		 }
		 if( iCur - iLeft > 1 ){
			 /* Recurse and process this expression */
			 rc = ExprMakeTree(&(*pGen), &apNode[iLeft + 1], iCur - iLeft - 1);
			 if( rc != SXRET_OK ){
				 return rc;
			 }
		 }
		 /* Free the left and right nodes */
		 ExprFreeTree(&(*pGen), apNode[iLeft]);
		 ExprFreeTree(&(*pGen), apNode[iCur]);
		 apNode[iLeft] = 0;
		 apNode[iCur] = 0;
	 }
	 /* Handle postfix [i.e: function call, member access] operators with precedence 2 */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 2 && pNode->pLeft == 0  ){
			 if( pNode->pOp->iOp == EXPR_OP_FUNC_CALL ){
				 /* Collect function arguments */
				 sxi32 iPtr = 0;
				 sxi32 nFuncTok = 0;
				 while( nFuncTok + iCur < nToken ){
					 if( apNode[nFuncTok+iCur] ){
						 if( apNode[nFuncTok+iCur]->pStart->nType & JX9_TK_LPAREN /*'('*/ ){
							 iPtr++;
						 }else if ( apNode[nFuncTok+iCur]->pStart->nType & JX9_TK_RPAREN /*')'*/){
							 iPtr--;
							 if( iPtr <= 0 ){
								 break;
							 }
						 }
					 }
					 nFuncTok++;
				 }
				 if( nFuncTok + iCur >= nToken ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "Missing right parenthesis ')'");
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
				 if(  iLeft < 0 || !NODE_ISTERM(iLeft) /*|| ( apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec != 2)*/ ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "Invalid function name");
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 if( nFuncTok > 1 ){
					 /* Process function arguments */
					 rc = ExprProcessFuncArguments(&(*pGen), pNode, &apNode[iCur+1], nFuncTok-1);
					 if( rc != SXRET_OK ){
						 return rc;
					 }
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 apNode[iLeft] = 0;
				 for( iPtr = 1; iPtr <= nFuncTok ; iPtr++ ){
					 apNode[iCur+iPtr] = 0;
				 }
			 }else if (pNode->pOp->iOp == EXPR_OP_SUBSCRIPT ){
				 /* Subscripting */
				 sxi32 iArrTok = iCur + 1;
				 sxi32 iNest = 1;
				 if(  iLeft >= 0 && (apNode[iLeft]->xCode == jx9CompileVariable || (apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec == 2 /* postfix */) ) ){
					 /* Collect index tokens */
				    while( iArrTok < nToken ){
					 if( apNode[iArrTok] ){
						 if( apNode[iArrTok]->pStart->nType & JX9_TK_OSB /*'['*/){
							 /* Increment nesting level */
							 iNest++;
						 }else if( apNode[iArrTok]->pStart->nType & JX9_TK_CSB /*']'*/){
							 /* Decrement nesting level */
							 iNest--;
							 if( iNest <= 0 ){
								 break;
							 }
						 }
					 }
					 ++iArrTok;
				   }
				   if( iArrTok > iCur + 1 ){
					 /* Recurse and process this expression */
					 rc = ExprMakeTree(&(*pGen), &apNode[iCur+1], iArrTok - iCur - 1);
					 if( rc != SXRET_OK ){
						 return rc;
					 }
					 /* Link the node to it's index */
					 SySetPut(&pNode->aNodeArgs, (const void *)&apNode[iCur+1]);
				   }
				   /* Link the node to the tree */
				   pNode->pLeft = apNode[iLeft];
				   pNode->pRight = 0;
				   apNode[iLeft] = 0;
				   for( iNest = iCur + 1 ; iNest <= iArrTok ; ++iNest ){
					 apNode[iNest] = 0;
				  }
				 }
			 }else{
				 /* Member access operators [i.e: '.' ] */
				 iRight = iCur + 1;
				 while( iRight < nToken && apNode[iRight] == 0 ){
					 iRight++;
				 }
				 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid member name", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 if( pNode->pLeft->pOp == 0 && pNode->pLeft->xCode != jx9CompileVariable ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, 
						 "'%z': Expecting a variable as left operand", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 pNode->pRight = apNode[iRight];
				 apNode[iLeft] = apNode[iRight] = 0;
			 }
		 }
		 iLeft = iCur;
	 }
	  /* Handle post/pre icrement/decrement [i.e: ++/--] operators with precedence 3 */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 3 && pNode->pLeft == 0){
			 if( iLeft >= 0 && ((apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec == 2 /* Postfix */)
				 || apNode[iLeft]->xCode == jx9CompileVariable) ){
					 /* Link the node to the tree */
					 pNode->pLeft = apNode[iLeft];
					 apNode[iLeft] = 0; 
			 }
		  }
		 iLeft = iCur;
	  }
	 iLeft = -1;
	 for( iCur = nToken -  1 ; iCur >= 0 ; iCur-- ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 3 && pNode->pLeft == 0){
			 if( iLeft < 0 || (apNode[iLeft]->pOp == 0 && apNode[iLeft]->xCode != jx9CompileVariable)
				 || ( apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec != 2 /* Postfix */) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z' operator needs l-value", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
			 }
			 /* Link the node to the tree */
			 pNode->pLeft = apNode[iLeft];
			 apNode[iLeft] = 0;
			 /* Mark as pre-increment/decrement node */
			 pNode->iFlags |= EXPR_NODE_PRE_INCR;
		  }
		 iLeft = iCur;
	 }
	 /* Handle right associative unary and cast operators [i.e: !, (string), ~...]  with precedence 4 */
	  iLeft = 0;
	  for( iCur = nToken -  1 ; iCur >= 0 ; iCur-- ){
		  if( apNode[iCur] ){
			  pNode = apNode[iCur];
			  if( pNode->pOp && pNode->pOp->iPrec == 4 && pNode->pLeft == 0){
				  if( iLeft > 0 ){
					  /* Link the node to the tree */
					  pNode->pLeft = apNode[iLeft];
					  apNode[iLeft] = 0;
					  if( pNode->pLeft && pNode->pLeft->pOp && pNode->pLeft->pOp->iPrec > 4 ){
						  if( pNode->pLeft->pLeft == 0 || pNode->pLeft->pRight == 0 ){
							   /* Syntax error */
							  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pLeft->pStart->nLine, "'%z': Missing operand", &pNode->pLeft->pOp->sOp);
							  if( rc != SXERR_ABORT ){
								  rc = SXERR_SYNTAX;
							  }
							  return rc;
						  }
					  }
				  }else{
					  /* Syntax error */
					  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing operand", &pNode->pOp->sOp);
					  if( rc != SXERR_ABORT ){
						  rc = SXERR_SYNTAX;
					  }
					  return rc;
				  }
			  }
			  /* Save terminal position */
			  iLeft = iCur;
		  }
	  }	 
	 /* Process left and non-associative binary operators [i.e: *, /, &&, ||...]*/
	 for( i = 7 ; i < 17 ; i++ ){
		 iLeft = -1;
		 for( iCur = 0 ; iCur < nToken ; ++iCur ){
			 if( apNode[iCur] == 0 ){
				 continue;
			 }
			 pNode = apNode[iCur];
			 if( pNode->pOp && pNode->pOp->iPrec == i && pNode->pLeft == 0 ){
				 /* Get the right node */
				 iRight = iCur + 1;
				 while( iRight < nToken && apNode[iRight] == 0 ){
					 iRight++;
				 }
				 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 pNode->pRight = apNode[iRight];
				 apNode[iLeft] = apNode[iRight] = 0;
			 }
			 iLeft = iCur;
		 }
	 }
	 /* Handle the ternary operator. (expr1) ? (expr2) : (expr3) 
	  * Note that we do not need a precedence loop here since
	  * we are dealing with a single operator.
	  */
	  iLeft = -1;
	  for( iCur = 0 ; iCur < nToken ; ++iCur ){
		  if( apNode[iCur] == 0 ){
			  continue;
		  }
		  pNode = apNode[iCur];
		  if( pNode->pOp && pNode->pOp->iOp == EXPR_OP_QUESTY && pNode->pLeft == 0 ){
			  sxi32 iNest = 1;
			  if( iLeft < 0 || !NODE_ISTERM(iLeft) ){
				  /* Missing condition */
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Syntax error", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					  rc = SXERR_SYNTAX;
				  }
				  return rc;
			  }
			  /* Get the right node */
			  iRight = iCur + 1;
			  while( iRight < nToken  ){
				  if( apNode[iRight] ){
					  if( apNode[iRight]->pOp && apNode[iRight]->pOp->iOp == EXPR_OP_QUESTY && apNode[iRight]->pCond == 0){
						  /* Increment nesting level */
						  ++iNest;
					  }else if( apNode[iRight]->pStart->nType & JX9_TK_COLON /*:*/ ){
						  /* Decrement nesting level */
						  --iNest;
						  if( iNest <= 0 ){
							  break;
						  }
					  }
				  }
				  iRight++;
			  }
			  if( iRight > iCur + 1 ){
				  /* Recurse and process the then expression */
				  rc = ExprMakeTree(&(*pGen), &apNode[iCur + 1], iRight - iCur - 1);
				  if( rc != SXRET_OK ){
					  return rc;
				  }
				  /* Link the node to the tree */
				  pNode->pLeft = apNode[iCur + 1];
			  }else{
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing 'then' expression", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			  }
			  apNode[iCur + 1] = 0;
			  if( iRight + 1 < nToken ){
				  /* Recurse and process the else expression */
				  rc = ExprMakeTree(&(*pGen), &apNode[iRight + 1], nToken - iRight - 1);
				  if( rc != SXRET_OK ){
					  return rc;
				  }
				  /* Link the node to the tree */
				  pNode->pRight = apNode[iRight + 1];
				  apNode[iRight + 1] =  apNode[iRight] = 0;
			  }else{
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing 'else' expression", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			  }
			  /* Point to the condition */
			  pNode->pCond  = apNode[iLeft];
			  apNode[iLeft] = 0;
			  break;
		  }
		  iLeft = iCur;
	  }
	 /* Process right associative binary operators [i.e: '=', '+=', '/='] 
	  * Note: All right associative binary operators have precedence 18
	  * so there is no need for a precedence loop here.
	  */
	 iRight = -1;
	 for( iCur = nToken -  1 ; iCur >= 0 ; iCur--){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 18 && pNode->pLeft == 0 ){
			 /* Get the left node */
			 iLeft = iCur - 1;
			 while( iLeft >= 0 && apNode[iLeft] == 0 ){
				 iLeft--;
			 }
			 if( iLeft < 0 || iRight < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
				 /* Syntax error */
				 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
				 if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			 }
			 if( ExprIsModifiableValue(apNode[iLeft]) == FALSE ){
				 if( pNode->pOp->iVmOp != JX9_OP_STORE  ){
					 /* Left operand must be a modifiable l-value */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, 
						 "'%z': Left operand must be a modifiable l-value", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
			 }
			 /* Link the node to the tree (Reverse) */
			 pNode->pLeft = apNode[iRight];
			 pNode->pRight = apNode[iLeft];
			 apNode[iLeft] = apNode[iRight] = 0;
		 }
		 iRight = iCur;
	 }
	 /* Process the lowest precedence operator (22, comma) */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 22 /* ',' */ && pNode->pLeft == 0 ){
			 /* Get the right node */
			 iRight = iCur + 1;
			 while( iRight < nToken && apNode[iRight] == 0 ){
				 iRight++;
			 }
			 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
				 /* Syntax error */
				 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
				 if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			 }
			 /* Link the node to the tree */
			 pNode->pLeft = apNode[iLeft];
			 pNode->pRight = apNode[iRight];
			 apNode[iLeft] = apNode[iRight] = 0;
		 }
		 iLeft = iCur;
	 }
	 /* Point to the root of the expression tree */
	 for( iCur = 1 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] ){
			 if( (apNode[iCur]->pOp || apNode[iCur]->xCode ) && apNode[0] != 0){
				 rc = jx9GenCompileError(pGen, E_ERROR, apNode[iCur]->pStart->nLine, "Unexpected token '%z'", &apNode[iCur]->pStart->sData);
				  if( rc != SXERR_ABORT ){
					  rc = SXERR_SYNTAX;
				  }
				  return rc;  
			 }
			 apNode[0] = apNode[iCur];
			 apNode[iCur] = 0;
		 }
	 }
	 return SXRET_OK;
 }